

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

unique_ptr<so_5::stats::messages::work_thread_activity,_std::default_delete<so_5::stats::messages::work_thread_activity>_>
 __thiscall
so_5::details::make_message_instance_impl<false,so_5::stats::messages::work_thread_activity>::
make<so_5::stats::prefix_t,so_5::stats::suffix_t,std::thread::id_const&,so_5::stats::work_thread_activity_stats_t_const&>
          (make_message_instance_impl<false,so_5::stats::messages::work_thread_activity> *this,
          prefix_t *args,suffix_t *args_1,id *args_2,work_thread_activity_stats_t *args_3)

{
  work_thread_activity *this_00;
  work_thread_activity_stats_t *args_local_3;
  id *args_local_2;
  suffix_t *args_local_1;
  prefix_t *args_local;
  
  ensure_not_signal<so_5::stats::messages::work_thread_activity>();
  this_00 = (work_thread_activity *)operator_new(0x88);
  stats::messages::work_thread_activity::work_thread_activity(this_00,args,args_1,args_2,*args_3);
  std::
  unique_ptr<so_5::stats::messages::work_thread_activity,std::default_delete<so_5::stats::messages::work_thread_activity>>
  ::unique_ptr<std::default_delete<so_5::stats::messages::work_thread_activity>,void>
            ((unique_ptr<so_5::stats::messages::work_thread_activity,std::default_delete<so_5::stats::messages::work_thread_activity>>
              *)this,this_00);
  return (__uniq_ptr_data<so_5::stats::messages::work_thread_activity,_std::default_delete<so_5::stats::messages::work_thread_activity>,_true,_true>
          )(__uniq_ptr_data<so_5::stats::messages::work_thread_activity,_std::default_delete<so_5::stats::messages::work_thread_activity>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}